

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

void __thiscall
Compiler::processFunction
          (Compiler *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *line,bool destroyReturnValue)

{
  InstructionGenerator *this_00;
  string *identifier;
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  bool bVar4;
  DataType DVar5;
  uint uVar6;
  uint uVar7;
  Scope *pSVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  undefined7 in_register_00000011;
  uint a;
  allocator local_e5;
  undefined4 local_e4;
  string local_e0;
  Compiler *local_c0;
  Scope *local_b8;
  string local_b0;
  undefined1 local_90 [48];
  undefined1 local_60 [48];
  
  DVar5 = stringToDataType((line->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start);
  identifier = (line->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
  if (((DVar5 == UNKNOWN) ||
      ((ulong)((long)(line->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)identifier) < 0x41)) ||
     (*identifier[2]._M_dataplus._M_p != '(')) {
    pSVar8 = getPastScope(this,identifier);
    if (pSVar8 == (Scope *)0x0) {
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      std::operator+(&local_e0,"Failed to find entry point for \'",
                     (line->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start);
      std::operator+(__return_storage_ptr__,&local_e0,"\'");
      __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
    if (pSVar8->returnType != VOID) {
      std::__cxx11::string::string((string *)&local_e0,"",&local_e5);
      InstructionGenerator::genCreateDefaultValue(&this->igen,&local_e0,pSVar8->returnType);
      std::__cxx11::string::~string((string *)&local_e0);
    }
    std::__cxx11::string::string((string *)&local_e0,"functionEnd",&local_e5);
    local_e4 = (undefined4)CONCAT71(in_register_00000011,destroyReturnValue);
    this_00 = &this->igen;
    local_b8 = pSVar8;
    InstructionGenerator::genCreateInt(this_00,&local_e0,0);
    std::__cxx11::string::~string((string *)&local_e0);
    puVar1 = (this->bytecode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    puVar2 = (this->bytecode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar6 = VirtualStack::getStackSize(&this_00->super_VirtualStack);
    std::__cxx11::string::string
              ((string *)&local_b0,
               (string *)
               ((line->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + 1));
    local_c0 = this;
    evaluateBracket(this,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    uVar7 = VirtualStack::getStackSize(&this_00->super_VirtualStack);
    for (; pSVar8 = local_b8, uVar6 < uVar7; uVar6 = uVar6 + 1) {
      VirtualStack::pop((Variable *)local_60,&this_00->super_VirtualStack);
      std::__cxx11::string::~string((string *)(local_60 + 8));
    }
    puVar3 = (local_c0->bytecode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar3[((ulong)((long)puVar1 - (long)puVar2) >> 2) + 0xffffffff & 0xffffffff] =
         (int)((ulong)((long)(local_c0->bytecode).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish - (long)puVar3) >> 2) + 2;
    InstructionGenerator::genGoto(this_00,local_b8->startPos);
    VirtualStack::pop((Variable *)local_90,&this_00->super_VirtualStack);
    std::__cxx11::string::~string((string *)(local_90 + 8));
    if (((byte)local_e4 & pSVar8->returnType != VOID) != 0) {
      InstructionGenerator::genStackWalk(this_00,1);
    }
  }
  else {
    Scope::reset(&this->expectedScopeType);
    (this->expectedScopeType).type = FUNCTION;
    std::__cxx11::string::_M_assign((string *)&(this->expectedScopeType).identifier);
    std::__cxx11::string::_M_assign((string *)&(this->expectedScopeType).incrementor);
    (this->expectedScopeType).returnType = DVar5;
    bVar4 = std::operator==((line->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1,"entry");
    if (bVar4) {
      puVar1 = (this->bytecode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar1[1] = (uint)((ulong)((long)(this->bytecode).
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1) >>
                        2);
    }
  }
  return;
}

Assistant:

void Compiler::processFunction(const std::vector<std::string>& line, bool destroyReturnValue)
{
    DataType possibleType = stringToDataType(line[0]);
    if(possibleType != DataType::UNKNOWN && line.size() > 2 && line[2][0] == '(') //If we're defining a function
    {
        //Reset the expected scope
        expectedScopeType.reset();

        //Add the function
        expectedScopeType.type = Scope::FUNCTION; //Store the scope type
        expectedScopeType.identifier = line[1]; //Store the function name
        expectedScopeType.incrementor = line[2]; //Store the function arguments
        expectedScopeType.returnType = possibleType; //Store the return value type

        //If this is the program entry point, update the entry point goto position
        if(line[1] == "entry")
            bytecode[1] = bytecode.size();
    }
    else //Else if we're calling a function
    {
        Scope *scope = getPastScope(line[0]);
        if(scope == nullptr)
            throw std::string("Failed to find entry point for '" + line[0] + "'");

        //Reserve space for return value if needed
        if(scope->returnType != DataType::VOID)
            igen.genCreateDefaultValue("", scope->returnType);

        //Create the exit point
        igen.genCreateInt("functionEnd", 0); //Add a bit for the stack walk below
        unsigned int exitPointPos = bytecode.size()-1;

        //Evaluate arguments, adding to the stack
        unsigned int sizeBeforeEvaluation = igen.getStackSize();
        evaluateBracket(line[1]);
        unsigned int sizeAfterEvaluation = igen.getStackSize();

        //Artificially remove them from the compiler's stack, as the values are already cleaned up by the function scope end
        for(unsigned int a = sizeBeforeEvaluation; a < sizeAfterEvaluation; a++)
            igen.pop();

        //update the exit point position
        bytecode[exitPointPos] = bytecode.size()+2;

        //Goto the function
        igen.genGoto(scope->startPos);

        //Remove exit point, it will have been used by the function
        igen.pop();

        //Remove return value if specified
        if(scope->returnType != DataType::VOID && destroyReturnValue)
        {
            igen.genStackWalk(1);
        }
    }
}